

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::MakeIfdefGuardIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view header_path)

{
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  string local_128;
  string local_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_e8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a8;
  AlphaNum local_88;
  size_type local_58;
  pointer local_50;
  
  s._M_len = header_path._M_len;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_e8,(char (*) [2])0x105b809,(char (*) [2])0xd6323e);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_c8,(char (*) [2])0x1096008,(char (*) [2])0xd6323e);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_a8,(char (*) [2])0xe5e0c8,(char (*) [2])0xd6323e);
  s._M_str = (char *)&local_e8;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x3;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_(&local_108,(lts_20250127 *)this,s,replacements);
  absl::lts_20250127::AsciiStrToUpper<>(&local_128,&local_108);
  local_58 = local_128._M_string_length;
  local_50 = local_128._M_dataplus._M_p;
  local_88.piece_ = absl::lts_20250127::NullSafeStringView("_");
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_58,&local_88,&local_88);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string MakeIfdefGuardIdentifier(const absl::string_view header_path) {
  return absl::StrCat(absl::AsciiStrToUpper(absl::StrReplaceAll(header_path,
                                                                {
                                                                    {"/", "_"},
                                                                    {".", "_"},
                                                                    {"-", "_"},
                                                                })),
                      "_");
}